

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

void TestConstExpr::ComparisonTestTU<long_long,int>(void)

{
  int iVar1;
  
  if (ComparisonTestTU<long_long,int>()::b1 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<long_long,int>()::b1);
    if (iVar1 != 0) {
      ComparisonTestTU<long_long,_int>::b1 = LessThanTest<long_long,int>();
      __cxa_guard_release(&ComparisonTestTU<long_long,int>()::b1);
    }
  }
  if (ComparisonTestTU<long_long,int>()::b2 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<long_long,int>()::b2);
    if (iVar1 != 0) {
      ComparisonTestTU<long_long,_int>::b2 = LessThanEqualTest<long_long,int>();
      __cxa_guard_release(&ComparisonTestTU<long_long,int>()::b2);
    }
  }
  if (ComparisonTestTU<long_long,int>()::b3 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<long_long,int>()::b3);
    if (iVar1 != 0) {
      ComparisonTestTU<long_long,_int>::b3 = GreaterThanTest<long_long,int>();
      __cxa_guard_release(&ComparisonTestTU<long_long,int>()::b3);
    }
  }
  if (ComparisonTestTU<long_long,int>()::b4 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<long_long,int>()::b4);
    if (iVar1 != 0) {
      ComparisonTestTU<long_long,_int>::b4 = GreaterThanEqualTest<long_long,int>();
      __cxa_guard_release(&ComparisonTestTU<long_long,int>()::b4);
    }
  }
  if (ComparisonTestTU<long_long,int>()::b5 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<long_long,int>()::b5);
    if (iVar1 != 0) {
      ComparisonTestTU<long_long,_int>::b5 = EqualTest<long_long,int>();
      __cxa_guard_release(&ComparisonTestTU<long_long,int>()::b5);
    }
  }
  if (ComparisonTestTU<long_long,int>()::b6 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<long_long,int>()::b6);
    if (iVar1 != 0) {
      ComparisonTestTU<long_long,_int>::b6 = NotEqualTest<long_long,int>();
      __cxa_guard_release(&ComparisonTestTU<long_long,int>()::b6);
    }
  }
  return;
}

Assistant:

void ComparisonTestTU()
	{
		static bool b1 = LessThanTest<T, U>();
		static bool b2 = LessThanEqualTest<T, U>();
		static bool b3 = GreaterThanTest<T, U>();
		static bool b4 = GreaterThanEqualTest<T, U>();
		static bool b5 = EqualTest<T, U>();
		static bool b6 = NotEqualTest<T, U>();
	}